

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::torrent
          (torrent *this,session_interface *ses,bool session_paused,add_torrent_params *p)

{
  undefined1 *puVar1;
  _Rb_tree_header *p_Var2;
  tracker_list *this_00;
  header_holder_type *phVar3;
  size_t *psVar4;
  byte bVar5;
  uint8_t uVar6;
  pointer pcVar7;
  time_t tVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  web_seed_entry *pwVar9;
  pointer pbVar10;
  size_type sVar11;
  torrent_info *ptVar12;
  pointer pvVar13;
  pointer pvVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  _Head_base<0UL,_unsigned_int_*,_false> _Var15;
  undefined4 uVar16;
  undefined4 uVar17;
  void *pvVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *pvVar26;
  vector<long,_std::allocator<long>_> *pvVar27;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *pvVar28;
  vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_> *pvVar29;
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  *pvVar30;
  vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *pvVar31;
  int64_t iVar32;
  pointer pwVar33;
  pointer __last;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *this_03;
  undefined1 auVar34 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var35;
  int iVar36;
  time_point32 tVar37;
  uint uVar38;
  int iVar39;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar40;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  mt19937 *__g;
  _Node *p_Var41;
  undefined4 extraout_var_05;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  _Var42;
  undefined4 extraout_var_06;
  add_torrent_params *this_04;
  string *psVar43;
  uint *puVar44;
  uint *puVar45;
  runtime_error *this_05;
  byte bVar46;
  byte bVar47;
  char *pcVar48;
  byte bVar49;
  uint uVar50;
  web_seed_entry *e;
  web_seed_entry *__args;
  pointer pbVar51;
  web_seed_t *__args_00;
  pointer piVar52;
  element_type *peVar53;
  uint *puVar54;
  uint *puVar55;
  uint uVar56;
  bool bVar57;
  string_view u;
  error_code eVar58;
  string_view f;
  vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> ws;
  announce_entry e_1;
  vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> local_198;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_178;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_170;
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
  *local_168;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
  *local_158;
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *local_150;
  undefined1 local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [5];
  byte local_dc;
  uint8_t local_db;
  byte local_da;
  string *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  deadline_timer *local_c8;
  deadline_timer *local_c0;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *local_b8;
  torrent_hot_members *local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> local_88;
  vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> local_68;
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  local_48;
  
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148;
  local_b0 = &this->super_torrent_hot_members;
  torrent_hot_members::torrent_hot_members(local_b0,ses,p,session_paused);
  (this->super_peer_class_set).m_size = '\0';
  (this->super_enable_shared_from_this<libtorrent::aux::torrent>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_request_callback)._vptr_request_callback = (_func_int **)&PTR__torrent_004e7478;
  this->m_dht_start_time = (duration)0x0;
  (this->m_ip_filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_ip_filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar16 = *(undefined4 *)((long)&p->total_uploaded + 4);
  iVar32 = p->total_downloaded;
  uVar17 = *(undefined4 *)((long)&p->total_downloaded + 4);
  *(int *)&this->m_total_uploaded = (int)p->total_uploaded;
  *(undefined4 *)((long)&this->m_total_uploaded + 4) = uVar16;
  *(int *)&this->m_total_downloaded = (int)iVar32;
  *(undefined4 *)((long)&this->m_total_downloaded + 4) = uVar17;
  (this->m_ssl_ctx)._M_t.
  super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>.
  _M_t.
  super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
  .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl = (context *)0x0;
  local_150 = &this->m_web_seeds;
  this->m_padding_bytes = 0;
  (this->m_storage).m_disk_io = (disk_interface *)0x0;
  (this->m_storage).m_idx.m_val = 0;
  (this->m_web_seeds).
  super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_150;
  (this->m_web_seeds).
  super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_150;
  (this->m_web_seeds).
  super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl._M_node._M_size = 0;
  local_b8 = &this->m_extensions;
  (this->m_extensions).
  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_b8;
  (this->m_extensions).
  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_b8;
  (this->m_extensions).
  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ._M_impl._M_node._M_size = 0;
  iVar36 = (*(ses->super_session_logger)._vptr_session_logger[7])(ses);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_tracker_timer).impl_,(io_context *)CONCAT44(extraout_var,iVar36),(type *)0x0)
  ;
  local_c0 = &this->m_tracker_timer;
  iVar36 = (*(ses->super_session_logger)._vptr_session_logger[7])(ses);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_inactivity_timer).impl_,(io_context *)CONCAT44(extraout_var_00,iVar36),
             (type *)0x0);
  local_158 = (vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
               *)&this->m_file_priority;
  p_Var2 = &(this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pcVar48 = (char *)0x0;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined1 (*) [16])&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL> =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x10 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x20 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x30 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x40 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x50 =
       (undefined1  [16])0x0;
  pvVar26 = &(this->m_file_priority).
             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ;
  (pvVar26->
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar26->
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_file_priority).
  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  .
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  this_00 = &this->m_trackers;
  (this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.
  super_simple_segregated_storage<unsigned_long> = (void *)0x0;
  (this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.list.ptr =
       (char *)0x0;
  (this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.list.sz = 0;
  *(undefined1 (*) [16])
   &(this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar27 = &(this->m_file_progress).m_file_progress.super_vector<long,_std::allocator<long>_>;
  (pvVar27->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar27->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_file_progress).m_file_progress.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  pvVar28 = &(this->m_suggest_pieces).m_priority_pieces.
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ;
  (pvVar28->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar28->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_suggest_pieces).m_priority_pieces.
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = (undefined1  [16])0x0;
  (this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.requested_size =
       0x70;
  (this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.next_size = 0x20
  ;
  (this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.start_size =
       0x20;
  phVar3 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  *(undefined1 (*) [16])
   &(this->m_trackers).m_storage.super_pool<boost::default_user_allocator_new_delete>.max_size =
       (undefined1  [16])0x0;
  (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_ =
       &phVar3->super_node;
  (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       &phVar3->super_node;
  (this->m_trackers).m_url_index._M_h._M_buckets =
       &(this->m_trackers).m_url_index._M_h._M_single_bucket;
  (this->m_trackers).m_url_index._M_h._M_bucket_count = 1;
  (this->m_trackers).m_url_index._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->m_trackers).m_url_index._M_h._M_element_count = 0;
  (this->m_trackers).m_url_index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8 = &this->m_trackerid;
  local_d0 = &(this->m_trackerid).field_2;
  *(undefined1 (*) [16])&(this->m_trackers).m_url_index._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_trackers).m_last_working_tracker = (undefined1  [16])0x0;
  (this->m_time_critical_pieces).
  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_time_critical_pieces).
  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_trackerid)._M_dataplus._M_p = (pointer)local_d0;
  pcVar7 = (p->trackerid)._M_dataplus._M_p;
  local_c8 = &this->m_inactivity_timer;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar7,pcVar7 + (p->trackerid)._M_string_length);
  f._M_str = pcVar48;
  f._M_len = (size_t)(p->save_path)._M_dataplus._M_p;
  complete_abi_cxx11_(&this->m_save_path,(libtorrent *)(p->save_path)._M_string_length,f);
  pvVar29 = &(this->m_merkle_trees).
             super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
  ;
  (pvVar29->
  super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar29->
  super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_predictive_pieces).
    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_predictive_pieces).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_predictive_pieces).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar36 = (*(ses->super_session_logger)._vptr_session_logger[0x4b])();
  this->m_stats_counters = (counters *)CONCAT44(extraout_var_01,iVar36);
  this->m_verified = (bitfield)0x0;
  this->m_verifying = (bitfield)0x0;
  *(undefined8 *)
   ((long)&(this->m_verifying).super_bitfield.m_buf.
           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 5) = 0;
  (this->m_error).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this->m_add_torrent_params =
       (__uniq_ptr_data<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>,_true,_true>
        )0x0;
  this->m_name = (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )0x0;
  lVar40 = p->added_time;
  if (lVar40 == 0) {
    lVar40 = time((time_t *)0x0);
  }
  local_170 = &this->m_verified;
  local_178 = &this->m_verifying;
  local_168 = &this->m_add_torrent_params;
  local_160 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&this->m_name;
  this->m_added_time = lVar40;
  this->m_completed_time = p->completed_time;
  tVar8 = p->last_seen_complete;
  this->m_last_seen_complete = tVar8;
  this->m_swarm_last_seen_complete = tVar8;
  uVar19 = *(undefined8 *)((p->info_hashes).v1.m_number._M_elems + 2);
  uVar20 = *(undefined8 *)((p->info_hashes).v1.m_number._M_elems + 4);
  uVar21 = *(undefined8 *)((p->info_hashes).v2.m_number._M_elems + 1);
  uVar22 = *(undefined8 *)((p->info_hashes).v2.m_number._M_elems + 3);
  uVar23 = *(undefined8 *)((p->info_hashes).v2.m_number._M_elems + 5);
  *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
       *(undefined8 *)(p->info_hashes).v1.m_number._M_elems;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar19;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar20;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar21;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) = uVar22;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar23;
  (this->m_info_hash).v2.m_number._M_elems[7] = (p->info_hashes).v2.m_number._M_elems[7];
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL> = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x4 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x8 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0xc = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x10 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x14 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x18 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x1c = 0xffffffff;
  this->m_num_verified = 0;
  tVar37 = time_now32();
  (this->m_started).__d.__r = (rep_conflict)tVar37.__d.__r;
  tVar37 = time_now32();
  (this->m_became_seed).__d.__r = (rep_conflict)tVar37.__d.__r;
  tVar37 = time_now32();
  (this->m_became_finished).__d.__r = (rep_conflict)tVar37.__d.__r;
  this->m_checking_piece = 0;
  this->m_num_checked_pieces = 0;
  (this->m_error_file).m_val = -1;
  this->m_average_piece_time = 0;
  this->m_piece_time_deviation = 0;
  this->m_total_failed_bytes = 0;
  this->m_total_redundant_bytes = 0;
  (this->m_sequence_number).m_val = -1;
  p_Var2 = &(this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_peers_to_disconnect).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_peers_to_disconnect).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_peers_to_disconnect).
           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = (undefined1  [16])0x0;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_peer_class).m_val = 0;
  this->m_num_connecting = 0;
  iVar36 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  generate_peer_id(&this->m_peer_id,(session_settings *)CONCAT44(extraout_var_02,iVar36));
  tVar37 = time_now32();
  (this->m_upload_mode_time).__d.__r = (rep_conflict)tVar37.__d.__r;
  bVar57 = ((p->flags).m_val & 0x10) == 0;
  bVar49 = this->field_0x5c0;
  bVar5 = this->field_0x5cc;
  this->field_0x5c0 = bVar49 & 0xfe | bVar57;
  bVar49 = bVar49 & 0xf0 | bVar57 | (byte)(p->flags).m_val >> 3 & 2;
  this->field_0x5c0 = bVar49 ^ 2;
  this->field_0x5c0 = (bVar49 ^ 2) & 3 | ((char)p->storage_mode & 3) << 4;
  this->m_waiting_tracker = '\0';
  this->m_active_time = 0;
  this->m_finished_time = 0;
  bVar49 = (byte)((uint)(p->flags).m_val >> 9) & 1;
  this->field_0x5cc = bVar5 & 0xf8 | bVar49;
  bVar46 = (byte)((uint)(p->flags).m_val >> 5) & 8;
  this->field_0x5cc = bVar5 & 0xf0 | bVar49 | bVar46;
  bVar47 = (byte)((uint)(p->flags).m_val >> 6) & 0x10;
  this->field_0x5cc = bVar5 & 0xe0 | bVar49 | bVar46 | bVar47;
  bVar49 = (bVar5 & 0xc0 | bVar49 | bVar46 | bVar47 | (byte)((uint)(p->flags).m_val >> 0xe) & 0x20)
           ^ 0x20;
  this->field_0x5cc = bVar49;
  bVar49 = (bVar49 & 0xb9 | (byte)((uint)(p->flags).m_val >> 0xe) & 0x40) ^ 0x40;
  this->field_0x5cc = bVar49;
  this->field_0x5cc = bVar49 & 0x79 | (byte)((uint)(p->flags).m_val >> 0x11) & 0x80;
  this->m_seeding_time = 0;
  *(undefined3 *)&this->field_0x5d4 = 0xffffff;
  this->m_need_save_resume_data = '\0';
  uVar38 = *(uint *)&this->field_0x5d8;
  *(uint *)&this->field_0x5d8 = uVar38 & 0xff000000;
  uVar38 = (uVar38 & 0xfe000000) + ((uint)(p->flags).m_val & 0x200000) * 8 ^ 0x1000000;
  *(uint *)&this->field_0x5d8 = uVar38;
  *(uint *)&this->field_0x5d8 = uVar38 & 0xf1000000 | ((uint)(p->flags).m_val & 8) << 0x16;
  iVar36 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  _Stack_140._M_pi._0_1_ = false;
  local_148 = (undefined1  [8])(CONCAT44(extraout_var_03,iVar36) + 0x438);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_148);
  _Stack_140._M_pi._0_1_ = true;
  uVar6 = *(uint8_t *)(CONCAT44(extraout_var_03,iVar36) + 0x330);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_148);
  this->m_connect_boost_counter = uVar6;
  uVar38 = *(uint *)&this->field_0x5dd;
  *(uint *)&this->field_0x5dd = uVar38 | 0xffffff;
  *(uint *)&this->field_0x5dd =
       (uVar38 & 0xf8ffffff | 0xffffff | ((uint)(p->flags).m_val & 0x10) << 0x14) ^ 0x1000000;
  tVar37 = from_time_t(p->last_download);
  (this->m_last_download).__d.__r = (rep_conflict)tVar37.__d.__r;
  this->m_num_seeds = 0;
  this->m_num_connecting_seeds = 0;
  tVar37 = from_time_t(p->last_upload);
  (this->m_last_upload).__d.__r = (rep_conflict)tVar37.__d.__r;
  pvVar18 = (p->userdata).m_client_ptr;
  (this->m_userdata).m_type_ptr = (p->userdata).m_type_ptr;
  (this->m_userdata).m_client_ptr = pvVar18;
  *(uint *)&this->field_0x600 =
       ((uint)(p->flags).m_val >> 5 & 1) + (*(uint *)&this->field_0x600 & 0x80000000) + 0x7fffff9e;
  this->field_0x606 = this->field_0x606 & 0x80;
  *(undefined2 *)&this->field_0x604 = 0;
  if (((p->flags).m_val & 0x2000) != 0) {
    (this->m_need_save_resume_data).m_val = (this->m_need_save_resume_data).m_val | 0x80;
  }
  if ((this->field_0x5db & 2) == 0) {
    iVar36 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x4b])();
    counters::inc_stats_counter((counters *)CONCAT44(extraout_var_04,iVar36),0xdb,1);
  }
  peVar53 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar53 == (element_type *)0x0) {
    peVar53 = (p->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (peVar53 == (element_type *)0x0) {
      local_148 = (undefined1  [8])0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::info_hash_t&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),
                 (torrent_info **)local_148,(allocator<libtorrent::torrent_info> *)&local_198,
                 &this->m_info_hash);
    }
    else {
      _Stack_140._M_pi =
           (p->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_148 = (undefined1  [8])peVar53;
      if (_Stack_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_140._M_pi)->_M_use_count = (_Stack_140._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_140._M_pi)->_M_use_count = (_Stack_140._M_pi)->_M_use_count + 1;
        }
      }
    }
    _Var35._M_pi = _Stack_140._M_pi;
    auVar34 = local_148;
    local_148 = (undefined1  [8])0x0;
    _Stack_140._M_pi._0_1_ = false;
    _Stack_140._M_pi._1_7_ = 0;
    this_01 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->super_torrent_hot_members).m_torrent_file.
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar34;
    (this->super_torrent_hot_members).m_torrent_file.
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var35._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      if (_Stack_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
      }
    }
    peVar53 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (((peVar53->m_flags).m_val & 4) != 0) {
    this->field_0x5cc = this->field_0x5cc | 0x80;
  }
  if (0 < (peVar53->m_files).m_piece_length) {
    eVar58 = initialize_merkle_trees(this);
    if ((eVar58._0_8_ >> 0x20 & 1) != 0) {
      this_05 = (runtime_error *)__cxa_allocate_exception(0x40);
      ::std::runtime_error::runtime_error(this_05,"");
      *(undefined ***)this_05 = &PTR__system_error_004dec78;
      *(error_code *)(this_05 + 0x10) = eVar58;
      *(runtime_error **)(this_05 + 0x20) = this_05 + 0x30;
      *(undefined8 *)(this_05 + 0x28) = 0;
      this_05[0x30] = (runtime_error)0x0;
      __cxa_throw(this_05,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    peVar53 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_torrent_hot_members).m_size_on_disk = (peVar53->m_files).m_size_on_disk;
  }
  local_198.
  super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((p->flags).m_val & 0x1000) == 0) {
    __args = (peVar53->m_web_seeds).
             super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pwVar9 = (peVar53->m_web_seeds).
             super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__args != pwVar9) {
      do {
        ::std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>::
        emplace_back<libtorrent::web_seed_entry_const&>
                  ((vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>
                    *)&local_198,__args);
        __args = __args + 1;
      } while (__args != pwVar9);
      peVar53 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  if ((peVar53->m_files).m_piece_length < 1) {
    bVar57 = false;
  }
  else {
    iVar36 = file_storage::num_files(&peVar53->m_files);
    bVar57 = 1 < iVar36;
  }
  pbVar51 = (p->url_seeds).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (p->url_seeds).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar51 != pbVar10) {
    do {
      ::std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>> *)
                 &local_198,pbVar51);
      if (bVar57) {
        sVar11 = local_198.
                 super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].super_web_seed_entry.url.
                 _M_string_length;
        if ((sVar11 == 0) ||
           (local_198.
            super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].super_web_seed_entry.url._M_dataplus._M_p
            [sVar11 - 1] != '/')) {
          ::std::__cxx11::string::push_back
                    ((char)(local_198.
                            super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
      }
      ptVar12 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((ptVar12->m_files).m_piece_length < 1) {
        _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_148 = (undefined1  [8])local_138;
        local_138[0]._M_local_buf[0] = '\0';
        local_98 = (pointer)0x0;
        local_a8 = (undefined1  [16])0x0;
        torrent_info::add_url_seed
                  (ptVar12,(string *)
                           (local_198.
                            super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1),(string *)local_148,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_a8);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a8);
        if (local_148 != (undefined1  [8])local_138) {
          operator_delete((void *)local_148,
                          CONCAT71(local_138[0]._M_allocated_capacity._1_7_,
                                   local_138[0]._M_local_buf[0]) + 1);
        }
      }
      pbVar51 = pbVar51 + 1;
    } while (pbVar51 != pbVar10);
  }
  pwVar33 = local_198.
            super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __last = local_198.
           super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __g = random_engine();
  ::std::
  shuffle<libtorrent::aux::web_seed_t*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (pwVar33,__last,__g);
  this_03 = local_150;
  pwVar33 = local_198.
            super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__args_00 = local_198.
                   super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                   ._M_impl.super__Vector_impl_data._M_start; __args_00 != pwVar33;
      __args_00 = __args_00 + 1) {
    p_Var41 = ::std::__cxx11::
              list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
              _M_create_node<libtorrent::aux::web_seed_t>(this_03,__args_00);
    ::std::__detail::_List_node_base::_M_hook(&p_Var41->super__List_node_base);
    psVar4 = &(this->m_web_seeds).
              super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
              ._M_impl._M_node._M_size;
    *psVar4 = *psVar4 + 1;
  }
  if (((p->flags).m_val & 0x800) == 0) {
    tracker_list::replace
              (this_00,&(((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_urls).
                        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              );
  }
  pbVar51 = (p->trackers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (p->trackers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar51 != pbVar10) {
    piVar52 = (p->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar36 = 0;
    do {
      if (pbVar51->_M_string_length != 0) {
        u._M_str = (pbVar51->_M_dataplus)._M_p;
        u._M_len = pbVar51->_M_string_length;
        announce_entry::announce_entry((announce_entry *)local_148,u);
        if (piVar52 !=
            (p->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar36 = *piVar52;
          piVar52 = piVar52 + 1;
        }
        local_db = '\0';
        local_da = local_da & 0xf0 | 4;
        local_dc = (byte)iVar36;
        bVar57 = tracker_list::add_tracker(this_00,(announce_entry *)local_148);
        if ((bVar57) &&
           (ptVar12 = (this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr, (ptVar12->m_files).m_piece_length < 1)) {
          torrent_info::add_tracker
                    (ptVar12,(string *)local_138,(uint)local_dc,
                     local_da & (source_tex|source_magnet_link|source_client|source_torrent));
        }
        announce_entry::~announce_entry((announce_entry *)local_148);
      }
      pbVar51 = pbVar51 + 1;
    } while (pbVar51 != pbVar10);
  }
  this_02 = local_160;
  iVar36 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  _Stack_140._M_pi._0_1_ = false;
  local_148 = (undefined1  [8])(CONCAT44(extraout_var_05,iVar36) + 0x438);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_148);
  _Stack_140._M_pi._0_1_ = true;
  uVar38 = *(uint *)(CONCAT44(extraout_var_05,iVar36) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_148);
  if ((uVar38 >> 0x13 & 1) != 0) {
    tracker_list::prioritize_udp_trackers(this_00);
  }
  if ((((this->super_torrent_hot_members).m_torrent_file.
        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files).
      m_piece_length < 1) {
    sVar11 = (p->name)._M_string_length;
    if (sVar11 != 0) {
      psVar43 = (string *)operator_new(0x20);
      *(string **)psVar43 = psVar43 + 0x10;
      pcVar7 = (p->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>(psVar43,pcVar7,pcVar7 + sVar11);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = _Stack_140._M_pi;
      _local_148 = (unique_lock<std::mutex>)(auVar25 << 0x40);
      __ptr = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_02;
      *(string **)this_02 = psVar43;
      if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_02,__ptr);
        if (local_148 != (undefined1  [8])0x0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148);
        }
      }
    }
  }
  else {
    if (((((p->flags).m_val & 1) == 0) ||
        (_Var42 = ::std::
                  __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>const>>
                            ((p->file_priorities).
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (p->file_priorities).
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&dont_download),
        _Var42._M_current !=
        (p->file_priorities).
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) ||
       (_Var42 = ::std::
                 __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>const>>
                           ((p->piece_priorities).
                            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (p->piece_priorities).
                            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&dont_download),
       _Var42._M_current !=
       (p->piece_priorities).
       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar49 = 0;
    }
    else {
      _Var15._M_head_impl =
           *(uint **)&(p->have_pieces).super_bitfield.m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      puVar54 = _Var15._M_head_impl + 1;
      uVar38 = 0x80000000;
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var15._M_head_impl ==
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        puVar55 = (uint *)0x0;
        uVar56 = 0x80000000;
        puVar44 = (uint *)0x0;
      }
      else {
        uVar56 = *_Var15._M_head_impl;
        iVar36 = uVar56 + 0x3e;
        if (-1 < (int)(uVar56 + 0x1f)) {
          iVar36 = uVar56 + 0x1f;
        }
        puVar55 = puVar54 + ((long)(iVar36 >> 5) - (ulong)((uVar56 & 0x1f) != 0));
        uVar56 = 0x80000000 >> (sbyte)(uVar56 & 0x1f);
        puVar44 = puVar54;
      }
      do {
        puVar45 = puVar44;
        uVar50 = uVar38;
        if ((*puVar44 &
            (uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8 | uVar38 << 0x18))
            == 0) break;
        bVar57 = uVar38 == 1;
        puVar44 = puVar44 + bVar57;
        uVar38 = uVar38 >> 1;
        if (bVar57) {
          uVar38 = 0x80000000;
        }
      } while ((puVar44 != puVar55) || (puVar45 = puVar55, uVar50 = uVar56, uVar38 != uVar56));
      if (_Var15._M_head_impl == (uint *)0x0) {
        uVar38 = 0x80000000;
        puVar54 = (uint *)0x0;
      }
      else {
        uVar38 = *_Var15._M_head_impl;
        iVar36 = uVar38 + 0x3e;
        if (-1 < (int)(uVar38 + 0x1f)) {
          iVar36 = uVar38 + 0x1f;
        }
        puVar54 = puVar54 + ((long)(iVar36 >> 5) - (ulong)((uVar38 & 0x1f) != 0));
        uVar38 = 0x80000000 >> (sbyte)(uVar38 & 0x1f);
      }
      bVar49 = (uVar50 == uVar38 && puVar45 == puVar54) << 2;
    }
    this->field_0x5cc = this->field_0x5cc & 0xfb | bVar49;
    puVar1 = &(this->super_torrent_hot_members).field_0x4b;
    *puVar1 = *puVar1 | 2;
  }
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>>
            (local_158,
             (p->file_priorities).
             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (p->file_priorities).
             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((this->field_0x5cc & 4) != 0) {
    bitfield::resize(&local_170->super_bitfield,
                     (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces,false);
    bitfield::resize(&local_178->super_bitfield,
                     (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces,false);
  }
  iVar32 = p->total_downloaded;
  this->m_total_uploaded = p->total_uploaded;
  this->m_total_downloaded = iVar32;
  (this->m_active_time).__r = p->active_time;
  (this->m_finished_time).__r = p->finished_time;
  (this->m_seeding_time).__r = p->seeding_time;
  if ((this->m_completed_time != 0) && (this->m_completed_time < this->m_added_time)) {
    this->m_completed_time = this->m_added_time;
  }
  peVar53 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((0 < (peVar53->m_files).m_piece_length) &&
     (bVar57 = digest32<256L>::is_all_zeros(&(peVar53->m_info_hash).v2), !bVar57)) {
    pvVar13 = (p->merkle_trees).
              super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              .
              super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar14 = (p->merkle_trees).
              super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              .
              super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar13 != pvVar14) {
      local_48.
      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (p->merkle_trees).
           super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           .
           super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (p->merkle_trees).
      super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      .
      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar30 = &(p->merkle_trees).
                 super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      ;
      (pvVar30->
      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar30->
      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (p->merkle_tree_mask).
           super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
           super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_68.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (p->merkle_tree_mask).
           super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
           super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_68.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (p->merkle_tree_mask).
           super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
           super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (p->merkle_tree_mask).
      super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar31 = &(p->merkle_tree_mask).
                 super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>;
      (pvVar31->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar31->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (p->verified_leaf_hashes).
           super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
           super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_88.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (p->verified_leaf_hashes).
           super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
           super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_88.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (p->verified_leaf_hashes).
           super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
           super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (p->verified_leaf_hashes).
      super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
      super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar31 = &(p->verified_leaf_hashes).
                 super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>;
      (pvVar31->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar31->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pvVar13;
      local_48.
      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar14;
      load_merkle_trees(this,(vector<std::vector<sha256_hash>,_file_index_t> *)&local_48,
                        (vector<bitfield,_file_index_t> *)&local_68,
                        (vector<bitfield,_file_index_t> *)&local_88);
      ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::~vector(&local_88)
      ;
      ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::~vector(&local_68)
      ;
      ::std::
      vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
      ::~vector(&local_48);
    }
  }
  peVar53 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (0 < (peVar53->m_files).m_piece_length) {
    iVar36 = (peVar53->m_files).m_num_pieces;
    iVar39 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x4b])();
    counters::inc_stats_counter((counters *)CONCAT44(extraout_var_06,iVar39),0x6e,(long)iVar36);
  }
  this_04 = (add_torrent_params *)operator_new(0x350);
  add_torrent_params::add_torrent_params(this_04,p);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = _Stack_140._M_pi;
  _local_148 = (unique_lock<std::mutex>)(auVar24 << 0x40);
  ::std::
  __uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
  ::reset((__uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           *)local_168,this_04);
  ::std::
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>::
  ~unique_ptr((unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               *)local_148);
  ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::~vector
            (&local_198);
  return;
}

Assistant:

torrent::torrent(
		aux::session_interface& ses
		, bool const session_paused
		, add_torrent_params&& p)
		: torrent_hot_members(ses, p, session_paused)
		, m_total_uploaded(p.total_uploaded)
		, m_total_downloaded(p.total_downloaded)
		, m_tracker_timer(ses.get_context())
		, m_inactivity_timer(ses.get_context())
		, m_trackerid(p.trackerid)
		, m_save_path(complete(p.save_path))
		, m_stats_counters(ses.stats_counters())
		, m_added_time(p.added_time ? p.added_time : std::time(nullptr))
		, m_completed_time(p.completed_time)
		, m_last_seen_complete(p.last_seen_complete)
		, m_swarm_last_seen_complete(p.last_seen_complete)
		, m_info_hash(p.info_hashes)
		, m_error_file(torrent_status::error_file_none)
		, m_sequence_number(-1)
		, m_peer_id(aux::generate_peer_id(settings()))
		, m_announce_to_trackers(!(p.flags & torrent_flags::paused))
		, m_announce_to_lsd(!(p.flags & torrent_flags::paused))
		, m_has_incoming(false)
		, m_files_checked(false)
		, m_storage_mode(p.storage_mode)
		, m_announcing(false)
		, m_added(false)
		, m_sequential_download(p.flags & torrent_flags::sequential_download)
		, m_auto_sequential(false)
		, m_seed_mode(false)
#ifndef TORRENT_DISABLE_SUPERSEEDING
		, m_super_seeding(p.flags & torrent_flags::super_seeding)
#endif
		, m_stop_when_ready(p.flags & torrent_flags::stop_when_ready)
		, m_enable_dht(!bool(p.flags & torrent_flags::disable_dht))
		, m_enable_lsd(!bool(p.flags & torrent_flags::disable_lsd))
		, m_i2p(bool(p.flags & torrent_flags::i2p_torrent))
		, m_max_uploads((1 << 24) - 1)
		, m_num_uploads(0)
		, m_enable_pex(!bool(p.flags & torrent_flags::disable_pex))
		, m_apply_ip_filter(p.flags & torrent_flags::apply_ip_filter)
		, m_pending_active_change(false)
		, m_v2_piece_layers_validated(false)
		, m_connect_boost_counter(static_cast<std::uint8_t>(settings().get_int(settings_pack::torrent_connect_boost)))
		, m_incomplete(0xffffff)
		, m_announce_to_dht(!(p.flags & torrent_flags::paused))
		, m_ssl_torrent(false)
		, m_deleted(false)
		, m_last_download(aux::from_time_t(p.last_download))
		, m_last_upload(aux::from_time_t(p.last_upload))
		, m_userdata(p.userdata)
		, m_auto_managed(p.flags & torrent_flags::auto_managed)
		, m_current_gauge_state(static_cast<std::uint32_t>(no_gauge_state))
		, m_moving_storage(false)
		, m_inactive(false)
		, m_downloaded(0xffffff)
		, m_progress_ppm(0)
		, m_torrent_initialized(false)
		, m_outstanding_file_priority(false)
		, m_complete_sent(false)
	{
		if (p.flags & torrent_flags::need_save_resume)
		{
			m_need_save_resume_data |= torrent_handle::if_metadata_changed;
		}

		// we cannot log in the constructor, because it relies on shared_from_this
		// being initialized, which happens after the constructor returns.

#if TORRENT_USE_UNC_PATHS
		m_save_path = canonicalize_path(m_save_path);
#endif

		if (!m_apply_ip_filter)
		{
			inc_stats_counter(counters::non_filter_torrents);
		}

		if (!m_torrent_file)
			m_torrent_file = (p.ti ? p.ti : std::make_shared<torrent_info>(m_info_hash));

#if TORRENT_USE_I2P
		if (m_torrent_file->is_i2p())
			m_i2p = true;
#endif

		if (m_torrent_file->is_valid())
		{
			error_code ec = initialize_merkle_trees();
			if (ec) throw system_error(ec);
			m_size_on_disk = m_torrent_file->files().size_on_disk();
		}

		// --- WEB SEEDS ---

		// if override web seed flag is set, don't load any web seeds from the
		// torrent file.
		std::vector<web_seed_t> ws;
		if (!(p.flags & torrent_flags::deprecated_override_web_seeds))
		{
			for (auto const& e : m_torrent_file->internal_web_seeds())
				ws.emplace_back(e);
		}

		// add web seeds from add_torrent_params
		bool const multi_file = m_torrent_file->is_valid()
				&& m_torrent_file->num_files() > 1;

		for (auto const& u : p.url_seeds)
		{
			ws.emplace_back(u);

			// correct URLs to end with a "/" for multi-file torrents
			if (multi_file)
				ensure_trailing_slash(ws.back().url);
#if TORRENT_ABI_VERSION < 4
			if (!m_torrent_file->is_valid())
				m_torrent_file->add_url_seed(ws.back().url);
#endif
		}

		aux::random_shuffle(ws);
		for (auto& w : ws) m_web_seeds.emplace_back(std::move(w));

		// --- TRACKERS ---

		// if override trackers flag is set, don't load trackers from torrent file
		if (!(p.flags & torrent_flags::deprecated_override_trackers))
		{
			m_trackers.replace(m_torrent_file->internal_trackers());
		}

		int tier = 0;
		auto tier_iter = p.tracker_tiers.begin();
		for (auto const& url : p.trackers)
		{
			if (url.empty()) continue;

			aux::announce_entry e(url);
			if (tier_iter != p.tracker_tiers.end())
				tier = *tier_iter++;

			e.fail_limit = 0;
			e.source = lt::announce_entry::source_magnet_link;
			e.tier = std::uint8_t(tier);

			if (!m_trackers.add_tracker(e))
				continue;

#if TORRENT_ABI_VERSION < 4
			// add the tracker to the m_torrent_file here so that the trackers
			// will be preserved via create_torrent() when passing in just the
			// torrent_info object.
			if (!m_torrent_file->is_valid())
				m_torrent_file->add_tracker(e.url, e.tier, lt::announce_entry::tracker_source(e.source));
#endif
		}

		if (settings().get_bool(settings_pack::prefer_udp_trackers))
			m_trackers.prioritize_udp_trackers();

		if (m_torrent_file->is_valid())
		{
			// setting file- or piece priorities for seed mode makes no sense. If a
			// torrent ends up in seed mode by accident, it can be very confusing,
			// so assume the seed mode flag is not intended and don't enable it in
			// that case. Also, if the resume data says we're missing a piece, we
			// can't be in seed-mode.
			m_seed_mode = (p.flags & torrent_flags::seed_mode)
				&& std::find(p.file_priorities.begin(), p.file_priorities.end(), dont_download) == p.file_priorities.end()
				&& std::find(p.piece_priorities.begin(), p.piece_priorities.end(), dont_download) == p.piece_priorities.end()
				&& std::find(p.have_pieces.begin(), p.have_pieces.end(), false) == p.have_pieces.end();

			m_connections_initialized = true;
		}
		else
		{
			if (!p.name.empty()) m_name = std::make_unique<std::string>(p.name);
		}

		TORRENT_ASSERT(is_single_thread());
		m_file_priority.assign(p.file_priorities.begin(), p.file_priorities.end());

		if (m_seed_mode)
		{
			m_verified.resize(m_torrent_file->num_pieces(), false);
			m_verifying.resize(m_torrent_file->num_pieces(), false);
		}

		m_total_uploaded = p.total_uploaded;
		m_total_downloaded = p.total_downloaded;

		// the number of seconds this torrent has spent in started, finished and
		// seeding state so far, respectively.
		m_active_time = seconds(p.active_time);
		m_finished_time = seconds(p.finished_time);
		m_seeding_time = seconds(p.seeding_time);

		if (m_completed_time != 0 && m_completed_time < m_added_time)
			m_completed_time = m_added_time;

		// --- V2 HASHES ---

		if (m_torrent_file->is_valid() && m_torrent_file->info_hashes().has_v2())
		{
			if (!p.merkle_trees.empty())
				load_merkle_trees(
					std::move(p.merkle_trees)
					, std::move(p.merkle_tree_mask)
					, std::move(p.verified_leaf_hashes));

			// we really don't want to store extra copies of the trees
			TORRENT_ASSERT(p.merkle_trees.empty());
		}

		if (valid_metadata())
		{
			inc_stats_counter(counters::num_total_pieces_added
				, m_torrent_file->num_pieces());
		}

		// TODO: 3 we could probably get away with just saving a few fields here
		m_add_torrent_params = std::make_unique<add_torrent_params>(std::move(p));
	}